

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O2

uint32_t __thiscall ram::MinimizerEngine::Index::Find(Index *this,uint64_t key,uint64_t **dst)

{
  const_iterator cVar1;
  ulong uVar2;
  key_type local_18;
  
  local_18 = key * 2;
  cVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_ram::MinimizerEngine::Index::KeyEqual,_ram::MinimizerEngine::Index::Hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->locator)._M_h,&local_18);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>._M_cur ==
      (__node_type *)0x0) {
    uVar2 = 0;
  }
  else if ((*(byte *)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>
                            ._M_cur + 8) & 1) == 0) {
    uVar2 = *(ulong *)((long)cVar1.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>
                             ._M_cur + 0x10);
    *dst = (uint64_t *)
           ((uVar2 >> 0x1d & 0xfffffffffffffff8) +
           (long)(this->origins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    *dst = (ulong *)((long)cVar1.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_true>
                           ._M_cur + 0x10);
    uVar2 = 1;
  }
  return (uint32_t)uVar2;
}

Assistant:

std::uint32_t MinimizerEngine::Index::Find(
    std::uint64_t key,
    const std::uint64_t** dst) const {
  auto it = locator.find(key << 1);
  if (it == locator.end()) {
    return 0;
  }
  if (it->first & 1) {
    *dst = &(it->second);
    return 1;
  }
  *dst = &(origins[it->second >> 32]);
  return static_cast<std::uint32_t>(it->second);
}